

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_spatializer_init_preallocated
                    (ma_spatializer_config *pConfig,void *pHeap,ma_spatializer *pSpatializer)

{
  ma_vec3f mVar1;
  undefined8 local_108;
  float local_100;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_98;
  float local_90;
  ma_gainer_config local_78;
  ma_gainer_config gainerConfig;
  ma_spatializer_heap_layout heapLayout;
  ma_result result;
  ma_spatializer *pSpatializer_local;
  void *pHeap_local;
  ma_spatializer_config *pConfig_local;
  
  if (pSpatializer == (ma_spatializer *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    memset(pSpatializer,0,0xb8);
    if ((pConfig == (ma_spatializer_config *)0x0) || (pHeap == (void *)0x0)) {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      pConfig_local._4_4_ =
           ma_spatializer_get_heap_layout(pConfig,(ma_spatializer_heap_layout *)&gainerConfig);
      if (pConfig_local._4_4_ == MA_SUCCESS) {
        pSpatializer->_pHeap = pHeap;
        if (gainerConfig != (ma_gainer_config)0x0) {
          memset(pHeap,0,(size_t)gainerConfig);
        }
        pSpatializer->channelsIn = pConfig->channelsIn;
        pSpatializer->channelsOut = pConfig->channelsOut;
        pSpatializer->attenuationModel = pConfig->attenuationModel;
        pSpatializer->positioning = pConfig->positioning;
        pSpatializer->handedness = pConfig->handedness;
        pSpatializer->minGain = pConfig->minGain;
        pSpatializer->maxGain = pConfig->maxGain;
        pSpatializer->minDistance = pConfig->minDistance;
        pSpatializer->maxDistance = pConfig->maxDistance;
        pSpatializer->rolloff = pConfig->rolloff;
        pSpatializer->coneInnerAngleInRadians = pConfig->coneInnerAngleInRadians;
        pSpatializer->coneOuterAngleInRadians = pConfig->coneOuterAngleInRadians;
        pSpatializer->coneOuterGain = pConfig->coneOuterGain;
        pSpatializer->dopplerFactor = pConfig->dopplerFactor;
        pSpatializer->directionalAttenuationFactor = pConfig->directionalAttenuationFactor;
        pSpatializer->gainSmoothTimeInFrames = pConfig->gainSmoothTimeInFrames;
        mVar1 = ma_vec3f_init_3f(0.0,0.0,0.0);
        local_90 = mVar1.z;
        local_98 = mVar1._0_8_;
        (pSpatializer->position).z = local_90;
        (pSpatializer->position).x = (float)(undefined4)local_98;
        (pSpatializer->position).y = (float)local_98._4_4_;
        mVar1 = ma_vec3f_init_3f(0.0,0.0,-1.0);
        local_b0 = mVar1.z;
        local_b8 = mVar1._0_8_;
        (pSpatializer->direction).z = local_b0;
        (pSpatializer->direction).x = (float)(undefined4)local_b8;
        (pSpatializer->direction).y = (float)local_b8._4_4_;
        mVar1 = ma_vec3f_init_3f(0.0,0.0,0.0);
        local_d8 = mVar1._0_8_;
        local_d0 = mVar1.z;
        (pSpatializer->velocity).x = (float)(undefined4)local_d8;
        (pSpatializer->velocity).y = (float)local_d8._4_4_;
        (pSpatializer->velocity).z = local_d0;
        pSpatializer->dopplerPitch = 1.0;
        if (pSpatializer->handedness == ma_handedness_left) {
          mVar1 = ma_vec3f_neg(pSpatializer->direction);
          local_108 = mVar1._0_8_;
          local_100 = mVar1.z;
          (pSpatializer->direction).x = (float)(undefined4)local_108;
          (pSpatializer->direction).y = (float)local_108._4_4_;
          (pSpatializer->direction).z = local_100;
        }
        if (pConfig->pChannelMapIn != (ma_channel *)0x0) {
          pSpatializer->pChannelMapIn = (ma_channel *)((long)pHeap + heapLayout.sizeInBytes);
          ma_channel_map_copy_or_default
                    (pSpatializer->pChannelMapIn,(ulong)pSpatializer->channelsIn,
                     pConfig->pChannelMapIn,pSpatializer->channelsIn);
        }
        pSpatializer->pNewChannelGainsOut = (float *)((long)pHeap + heapLayout.channelMapInOffset);
        local_78 = ma_spatializer_gainer_config_init(pConfig);
        pConfig_local._4_4_ =
             ma_gainer_init_preallocated
                       (&local_78,(void *)((long)pHeap + heapLayout.newChannelGainsOffset),
                        &pSpatializer->gainer);
        if (pConfig_local._4_4_ == MA_SUCCESS) {
          pConfig_local._4_4_ = MA_SUCCESS;
        }
      }
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_spatializer_init_preallocated(const ma_spatializer_config* pConfig, void* pHeap, ma_spatializer* pSpatializer)
{
    ma_result result;
    ma_spatializer_heap_layout heapLayout;
    ma_gainer_config gainerConfig;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pSpatializer);

    if (pConfig == NULL || pHeap == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_spatializer_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pSpatializer->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pSpatializer->channelsIn                   = pConfig->channelsIn;
    pSpatializer->channelsOut                  = pConfig->channelsOut;
    pSpatializer->attenuationModel             = pConfig->attenuationModel;
    pSpatializer->positioning                  = pConfig->positioning;
    pSpatializer->handedness                   = pConfig->handedness;
    pSpatializer->minGain                      = pConfig->minGain;
    pSpatializer->maxGain                      = pConfig->maxGain;
    pSpatializer->minDistance                  = pConfig->minDistance;
    pSpatializer->maxDistance                  = pConfig->maxDistance;
    pSpatializer->rolloff                      = pConfig->rolloff;
    pSpatializer->coneInnerAngleInRadians      = pConfig->coneInnerAngleInRadians;
    pSpatializer->coneOuterAngleInRadians      = pConfig->coneOuterAngleInRadians;
    pSpatializer->coneOuterGain                = pConfig->coneOuterGain;
    pSpatializer->dopplerFactor                = pConfig->dopplerFactor;
    pSpatializer->directionalAttenuationFactor = pConfig->directionalAttenuationFactor;
    pSpatializer->gainSmoothTimeInFrames       = pConfig->gainSmoothTimeInFrames;
    pSpatializer->position                     = ma_vec3f_init_3f(0, 0,  0);
    pSpatializer->direction                    = ma_vec3f_init_3f(0, 0, -1);
    pSpatializer->velocity                     = ma_vec3f_init_3f(0, 0,  0);
    pSpatializer->dopplerPitch                 = 1;

    /* Swap the forward direction if we're left handed (it was initialized based on right handed). */
    if (pSpatializer->handedness == ma_handedness_left) {
        pSpatializer->direction = ma_vec3f_neg(pSpatializer->direction);
    }

    /* Channel map. This will be on the heap. */
    if (pConfig->pChannelMapIn != NULL) {
        pSpatializer->pChannelMapIn = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapInOffset);
        ma_channel_map_copy_or_default(pSpatializer->pChannelMapIn, pSpatializer->channelsIn, pConfig->pChannelMapIn, pSpatializer->channelsIn);
    }

    /* New channel gains for output channels. */
    pSpatializer->pNewChannelGainsOut = (float*)ma_offset_ptr(pHeap, heapLayout.newChannelGainsOffset);

    /* Gainer. */
    gainerConfig = ma_spatializer_gainer_config_init(pConfig);

    result = ma_gainer_init_preallocated(&gainerConfig, ma_offset_ptr(pHeap, heapLayout.gainerOffset), &pSpatializer->gainer);
    if (result != MA_SUCCESS) {
        return result;  /* Failed to initialize the gainer. */
    }

    return MA_SUCCESS;
}